

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsort_impl.h
# Opt level: O2

void secp256k1_heap_down(uchar *arr,size_t i,size_t heap_size,size_t stride,
                        _func_int_void_ptr_void_ptr_void_ptr *cmp,void *cmp_data)

{
  ulong uVar1;
  undefined8 uVar2;
  int iVar3;
  uchar *pk1;
  uchar *pk2;
  
  do {
    if (heap_size >> 1 <= i) {
      return;
    }
    uVar1 = i * 2 + 2;
    if (uVar1 < heap_size) {
      pk1 = arr + uVar1 * 8;
      iVar3 = secp256k1_ec_pubkey_sort_cmp(pk1,arr + i * 0x10 + 8,(void *)stride);
      if (iVar3 < 0) goto LAB_0021cbfc;
      pk2 = arr + i * 8;
      iVar3 = secp256k1_ec_pubkey_sort_cmp(pk1,pk2,(void *)stride);
      i = uVar1;
      if (iVar3 < 1) {
        return;
      }
    }
    else {
LAB_0021cbfc:
      pk1 = arr + i * 0x10 + 8;
      pk2 = arr + i * 8;
      iVar3 = secp256k1_ec_pubkey_sort_cmp(pk1,pk2,(void *)stride);
      if (iVar3 < 1) {
        return;
      }
      i = i * 2 | 1;
    }
    uVar2 = *(undefined8 *)pk2;
    *(undefined8 *)pk2 = *(undefined8 *)pk1;
    *(undefined8 *)pk1 = uVar2;
  } while( true );
}

Assistant:

static SECP256K1_INLINE void secp256k1_heap_down(unsigned char *arr, size_t i, size_t heap_size, size_t stride,
                            int (*cmp)(const void *, const void *, void *), void *cmp_data) {
    while (i < heap_size/2) {
        VERIFY_CHECK(i <= SIZE_MAX/2 - 1);
        /* Proof:
         * i < heap_size/2
         * i + 1 <= heap_size/2
         * 2*i + 2 <= heap_size <= SIZE_MAX
         * 2*i <= SIZE_MAX - 2
         */

        VERIFY_CHECK(secp256k1_heap_child1(i) < heap_size);
        /* Proof:
         * i < heap_size/2
         * i + 1 <= heap_size/2
         * 2*i + 2 <= heap_size
         * 2*i + 1 < heap_size
         * child1(i) < heap_size
         */

        /* Let [x] be notation for the contents at arr[x*stride].
         *
         * If [child1(i)] > [i] and [child2(i)] > [i],
         *   swap [i] with the larger child to ensure the new parent is larger
         *   than both children. When [child1(i)] == [child2(i)], swap [i] with
         *   [child2(i)].
         * Else if [child1(i)] > [i], swap [i] with [child1(i)].
         * Else if [child2(i)] > [i], swap [i] with [child2(i)].
         */
        if (secp256k1_heap_child2(i) < heap_size
                && 0 <= cmp(arr + secp256k1_heap_child2(i)*stride, arr + secp256k1_heap_child1(i)*stride, cmp_data)) {
            if (0 < cmp(arr + secp256k1_heap_child2(i)*stride, arr + i*stride, cmp_data)) {
                secp256k1_heap_swap(arr, i, secp256k1_heap_child2(i), stride);
                i = secp256k1_heap_child2(i);
            } else {
                /* At this point we have [child2(i)] >= [child1(i)] and we have
                 * [child2(i)] <= [i], and thus [child1(i)] <= [i] which means
                 * that the next comparison can be skipped. */
                return;
            }
        } else if (0 < cmp(arr + secp256k1_heap_child1(i)*stride, arr +         i*stride, cmp_data)) {
            secp256k1_heap_swap(arr, i, secp256k1_heap_child1(i), stride);
            i = secp256k1_heap_child1(i);
        } else {
            return;
        }
    }
    /* heap_size/2 <= i
     * heap_size/2 < i + 1
     * heap_size < 2*i + 2
     * heap_size <= 2*i + 1
     * heap_size <= child1(i)
     * Thus child1(i) and child2(i) are now out of bounds and we are at a leaf.
     */
}